

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_integrate_pdf<trng::gamma_dist<float>>(gamma_dist<float> *d)

{
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> first;
  StringRef capturedExpression;
  longlong *plVar1;
  ExprLhs<const_float_&> this;
  int __x;
  float fVar2;
  value_type vVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar4;
  AssertionHandler catchAssertionHandler;
  result_type tol;
  result_type s;
  int i;
  vector<float,_std::allocator<float>_> y;
  result_type dx;
  result_type x_max;
  result_type x_min;
  int samples;
  undefined4 in_stack_fffffffffffffea8;
  Flags in_stack_fffffffffffffeac;
  SourceLineInfo *in_stack_fffffffffffffeb0;
  gamma_dist<float> *in_stack_fffffffffffffeb8;
  SourceLineInfo *this_00;
  undefined8 in_stack_fffffffffffffec0;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> last;
  undefined4 in_stack_fffffffffffffec8;
  result_type_conflict1 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffed4;
  SourceLineInfo local_e0;
  StringRef local_d0;
  undefined1 local_c0 [76];
  float local_74;
  float *local_70;
  float *local_68;
  float local_60;
  result_type_conflict1 local_50;
  int local_4c;
  float local_48 [7];
  float local_2c;
  result_type_conflict1 local_28;
  float local_24;
  long local_20;
  longlong local_18;
  int local_c;
  
  local_18 = 0x100000;
  fVar2 = Catch::clara::std::numeric_limits<float>::epsilon();
  dVar4 = std::sqrt((double)CONCAT44(extraout_XMM0_Db,fVar2));
  dVar4 = std::round((double)(ulong)(uint)(1.0 / SUB84(dVar4,0)));
  local_20 = (long)SUB84(dVar4,0);
  plVar1 = std::min<long_long>(&local_18,&local_20);
  local_c = (int)*plVar1;
  local_24 = trng::gamma_dist<float>::icdf
                       (in_stack_fffffffffffffeb8,
                        (result_type_conflict1)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
  local_28 = trng::gamma_dist<float>::icdf
                       (in_stack_fffffffffffffeb8,
                        (result_type_conflict1)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
  local_2c = (local_28 - local_24) / (float)local_c;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x322f46);
  for (local_4c = 0; local_4c <= local_c; local_4c = local_4c + 1) {
    in_stack_fffffffffffffecc =
         trng::gamma_dist<float>::pdf
                   ((gamma_dist<float> *)
                    CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                    (result_type_conflict1)((ulong)in_stack_fffffffffffffec0 >> 0x20));
    local_50 = in_stack_fffffffffffffecc;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffeb0,
               (value_type_conflict5 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
              );
  }
  last._M_current = local_48;
  local_68 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                ((vector<float,_std::allocator<float>_> *)
                                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  local_70 = (float *)std::vector<float,_std::allocator<float>_>::end
                                ((vector<float,_std::allocator<float>_> *)
                                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  first._M_current._4_4_ = in_stack_fffffffffffffecc;
  first._M_current._0_4_ = in_stack_fffffffffffffec8;
  vVar3 = simpson_int<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    (first,last);
  local_60 = vVar3 * local_2c;
  local_74 = (64.0 / (float)local_c) / (float)local_c;
  local_d0 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffeb0,
                        CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  this_00 = &local_e0;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0x94);
  Catch::StringRef::StringRef((StringRef *)last._M_current,(char *)this_00);
  __x = (int)local_c0;
  capturedExpression.m_start._4_4_ = in_stack_fffffffffffffecc;
  capturedExpression.m_start._0_4_ = vVar3;
  capturedExpression.m_size._0_4_ = in_stack_fffffffffffffed0;
  capturedExpression.m_size._4_4_ = in_stack_fffffffffffffed4;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)last._M_current,(StringRef *)this_00,in_stack_fffffffffffffeb0,
             capturedExpression,in_stack_fffffffffffffeac);
  Catch::clara::std::abs(__x);
  uVar5 = extraout_XMM0_Da;
  this = Catch::Decomposer::operator<=
                   ((Decomposer *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                    (float *)0x323128);
  Catch::ExprLhs<float_const&>::operator<
            ((ExprLhs<const_float_&> *)this.m_lhs,(float *)CONCAT44(in_stack_fffffffffffffed4,uVar5)
            );
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)this.m_lhs,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  Catch::BinaryExpr<const_float_&,_const_float_&>::~BinaryExpr
            ((BinaryExpr<const_float_&,_const_float_&> *)0x323170);
  Catch::AssertionHandler::complete((AssertionHandler *)this.m_lhs);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)this.m_lhs);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)last._M_current);
  return;
}

Assistant:

void continuous_dist_test_integrate_pdf(const dist &d) {
  using result_type = typename dist::result_type;
  const int samples(static_cast<int>(std::min(
      1024ll * 1024, static_cast<long long>(std::round(
                         1 / std::sqrt(std::numeric_limits<result_type>::epsilon()))))));
  const result_type x_min{d.icdf(result_type(1) / result_type(100))};
  const result_type x_max{d.icdf(result_type(99) / result_type(100))};
  const result_type dx{(x_max - x_min) / samples};
  std::vector<result_type> y;
  for (int i{0}; i <= samples; ++i)
    y.push_back(d.pdf(x_min + i * dx));
  const result_type s{simpson_int(y.begin(), y.end()) * dx};
  const result_type tol{result_type(64) / result_type(samples) / result_type(samples)};
  REQUIRE(std::abs(s - result_type(98) / result_type(100)) < tol);
}